

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AtomEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  EncodedChar **p;
  undefined1 *puVar1;
  byte *pbVar2;
  EncodedChar *pEVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined4 *puVar10;
  ulong uVar11;
  Node *pNVar12;
  uint uVar13;
  EncodedChar cc;
  Char CVar14;
  CharCount n;
  CharCount i;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  Char local_32 [4];
  Char c;
  
  if (this->inputLim <= this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar5) goto LAB_00edd6a9;
    *puVar10 = 0;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00edd6a9;
    *puVar10 = 0;
  }
  p = &this->next;
  pbVar2 = this->next;
  if ((ASCIIChars::classes[*pbVar2] & 0x10) != 0) {
    if (this->inputLim < pbVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00edd6a9;
      *puVar10 = 0;
    }
    if (**p != '0') {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      iVar18 = 0;
      uVar11 = 0;
      do {
        uVar17 = uVar11;
        if (this->inputLim < this->next + uVar17) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        pEVar3 = *p;
        iVar18 = (uint)(byte)ASCIIChars::values[pEVar3[uVar17]] + iVar18 * 10;
        if (uVar17 == 4) {
          uVar17 = 4;
          uVar11 = 5;
          break;
        }
        if (this->inputLim < pEVar3 + uVar17 + 2) {
          uVar11 = (ulong)((int)uVar17 + 1);
          break;
        }
        if (this->inputLim < pEVar3 + uVar17 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        uVar11 = uVar17 + 1;
      } while ((ASCIIChars::classes[(*p)[uVar17 + 1]] & 0x10) != 0);
      if (iVar18 < (int)(uint)this->numGroups) {
        uVar11 = uVar11 & 0xffffffff;
        if (this->next + (uVar17 & 0xffffffff) + 2 <= this->inputLim) {
          if (this->inputLim < this->next + uVar11) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar5) goto LAB_00edd6a9;
            *puVar10 = 0;
          }
          if ((ASCIIChars::classes[(*p)[uVar11]] & 0x10) != 0) goto LAB_00edce38;
        }
        if (this->inputLim < this->next + uVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar17 = 0;
        do {
          if ((char)(*p)[uVar17] < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar5) goto LAB_00edd6a9;
            *puVar10 = 0;
          }
          uVar17 = uVar17 + 1;
          if (uVar11 == uVar17) {
            this->next = this->next + uVar11;
            pNVar12 = (Node *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee);
            pNVar12->tag = MatchGroup;
            pNVar12->features = 0;
            *(uint *)&pNVar12->field_0xc = *(uint *)&pNVar12->field_0xc & 0xffff8000;
            pNVar12->firstSet = (CharSet<char16_t> *)0x0;
            pNVar12->followSet = (CharSet<char16_t> *)0x0;
            (pNVar12->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar12->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar12->thisConsumes).upper = 0xffffffff;
            (pNVar12->followConsumes).upper = 0xffffffff;
            pNVar12->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559350;
            *(int *)&pNVar12[1]._vptr_Node = iVar18;
            *node = pNVar12;
            return false;
          }
        } while( true );
      }
LAB_00edce38:
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00edd6a9;
        *puVar10 = 0;
      }
      if ((ASCIIChars::classes[**p] & 0x20) == 0) {
        if (this->inputLim < *p) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        pbVar2 = this->next;
        deferredCharNode->cs[0] = (ushort)*pbVar2;
        if (this->inputLim < pbVar2 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        if (-1 < (char)**p) {
LAB_00edcfcf:
          *p = *p + 1;
          *node = &deferredCharNode->super_Node;
          return false;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (bVar5) {
          *puVar10 = 0;
          goto LAB_00edcfcf;
        }
        goto LAB_00edd6a9;
      }
    }
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00edd6a9;
      *puVar10 = 0;
    }
    if ((ASCIIChars::classes[**p] & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (!bVar5) {
LAB_00edd6a9:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar19 = 0;
    uVar13 = 0;
    do {
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00edd6a9;
        *puVar10 = 0;
      }
      uVar15 = (uint)(byte)ASCIIChars::values[**p] + uVar13 * 8;
      if (uVar15 < 0x100) {
        if (this->inputLim < *p + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        if ((char)**p < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        *p = *p + 1;
        uVar19 = uVar19 + 1;
        uVar13 = uVar15;
      }
      if ((0xff < uVar15) || (2 < uVar19)) break;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00edd6a9;
        *puVar10 = 0;
      }
    } while ((ASCIIChars::classes[**p] & 0x20) != 0);
    deferredCharNode->cs[0] = (Char)uVar13;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (this->inputLim < pbVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00edd6a9;
    *puVar10 = 0;
  }
  pEVar3 = *p;
  if (*pEVar3 == 'c') {
    if (this->inputLim < pEVar3 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00edd6a9;
      *puVar10 = 0;
    }
    CVar14 = L'\\';
    if ((ASCIIChars::classes[(*p)[1]] & 8) != 0) {
      if (this->inputLim < *p + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00edd6a9;
        *puVar10 = 0;
      }
      bVar6 = this->next[1];
      if (this->inputLim < this->next + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00edd6a9;
        *puVar10 = 0;
      }
      CVar14 = bVar6 & 0x1f;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar16 = 0;
      do {
        if ((char)(*p)[lVar16] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar5) goto LAB_00edd6a9;
          *puVar10 = 0;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 2);
      *p = *p + 2;
    }
    deferredCharNode->cs[0] = CVar14;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (this->inputLim <= pEVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar5) goto LAB_00edd6a9;
    *puVar10 = 0;
  }
  local_32[0] = UTF8EncodingPolicyBase<false>::ReadFull<true>
                          (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
  switch(local_32[0]) {
  case L'S':
    cc = 'S';
    goto LAB_00edd5f6;
  case L'T':
  case L'U':
  case L'V':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'`':
  case L'a':
  case L'c':
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
  case L'y':
  case L'z':
    goto switchD_00edcc13_caseD_54;
  case L'W':
    cc = 'W';
LAB_00edd5f6:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(this,cc);
    goto LAB_00edcc58;
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'{':
  case L'|':
  case L'}':
    break;
  case L'b':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee)
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
    (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
    puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper = 0xffffffff
    ;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper = 0xffffffff
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
    (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
         (_func_int **)&PTR_LiteralLength_01558d30;
    ((MatchSetNode *)deferredCharNode)->isNegation = false;
    ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
LAB_00edd683:
    ((MatchSetNode *)deferredCharNode)->field_0x3a = 0;
    bVar5 = true;
    goto LAB_00edcc5a;
  case L'd':
    bVar5 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00edcc5a;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    bVar5 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00edcc5a;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if ((((this->unicodeFlagPresent != true) ||
         (iVar18 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
         iVar18 < 1)) &&
        ((this->next + 4 <= this->inputLim &&
         (((bVar6 = ECLookahead(this,0), (ASCIIChars::classes[bVar6] & 0x40) != 0 &&
           (bVar6 = ECLookahead(this,1), (ASCIIChars::classes[bVar6] & 0x40) != 0)) &&
          (bVar6 = ECLookahead(this,2), (ASCIIChars::classes[bVar6] & 0x40) != 0)))))) &&
       (bVar6 = ECLookahead(this,3), (ASCIIChars::classes[bVar6] & 0x40) != 0)) {
      bVar6 = ECLookahead(this,0);
      bVar6 = ASCIIChars::values[bVar6];
      bVar7 = ECLookahead(this,1);
      bVar7 = ASCIIChars::values[bVar7];
      bVar8 = ECLookahead(this,2);
      bVar8 = ASCIIChars::values[bVar8];
      bVar9 = ECLookahead(this,3);
      local_32[0] = Chars<char16_t>::UTC
                              ((uint)(byte)ASCIIChars::values[bVar9] | (uint)bVar8 << 4 |
                               (uint)bVar7 << 8 | (uint)bVar6 << 0xc);
      n = 4;
LAB_00edd3a4:
      ECConsume(this,n);
    }
    break;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((this->unicodeFlagPresent == true) && (this->caseInsensitiveFlagPresent == true)) {
      StandardChars<char16_t>::SetWordIUChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00edcc58;
  case L'x':
    if (((this->next + 2 <= this->inputLim) &&
        (bVar6 = ECLookahead(this,0), (ASCIIChars::classes[bVar6] & 0x40) != 0)) &&
       (bVar6 = ECLookahead(this,1), (ASCIIChars::classes[bVar6] & 0x40) != 0)) {
      bVar6 = ECLookahead(this,0);
      bVar6 = ASCIIChars::values[bVar6];
      bVar7 = ECLookahead(this,1);
      local_32[0] = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar7] | (uint)bVar6 << 4);
      n = 2;
      goto LAB_00edd3a4;
    }
    break;
  default:
    uVar11 = (ulong)((ushort)local_32[0] - 0x24);
    if ((ushort)local_32[0] - 0x24 < 0x21) {
      if ((0x8000cf1UL >> (uVar11 & 0x3f) & 1) != 0) break;
      if (uVar11 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee);
        (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
        (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
        puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper =
             0xffffffff;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper =
             0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
             (_func_int **)&PTR_LiteralLength_01558d30;
        ((MatchSetNode *)deferredCharNode)->isNegation = true;
        ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
        goto LAB_00edd683;
      }
      if (uVar11 == 0x20) {
        cc = 'D';
        goto LAB_00edd5f6;
      }
    }
    goto switchD_00edcc13_caseD_54;
  }
switchD_00edcc13_caseD_5b:
  deferredCharNode->cs[0] = local_32[0];
LAB_00edcc58:
  bVar5 = false;
LAB_00edcc5a:
  *node = &deferredCharNode->super_Node;
  return bVar5;
switchD_00edcc13_caseD_54:
  if (this->unicodeFlagPresent == true) {
    Fail(this,-0x7ff5e9d6);
  }
  goto switchD_00edcc13_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }